

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::coap::Coap::Send(Error *__return_storage_ptr__,Coap *this,Message *aMessage)

{
  ErrorCode EVar1;
  ByteArray data;
  ByteArray local_78;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Message::Serialize((Error *)local_58,aMessage,&local_78);
  __return_storage_ptr__->mCode = local_58._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_50);
  EVar1 = __return_storage_ptr__->mCode;
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  if (EVar1 == kNone) {
    if (aMessage->mEndpoint == (Endpoint *)0x0) {
      aMessage->mEndpoint = this->mEndpoint;
    }
    (*aMessage->mEndpoint->_vptr_Endpoint[2])
              (local_58,aMessage->mEndpoint,&local_78,(ulong)aMessage->mSubType);
    __return_storage_ptr__->mCode = local_58._0_4_;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_50)
    ;
    if (local_50._M_p != local_40) {
      operator_delete(local_50._M_p);
    }
  }
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Coap::Send(const Message &aMessage)
{
    Error     error;
    ByteArray data;
    SuccessOrExit(error = aMessage.Serialize(data));

    if (aMessage.GetEndpoint() == nullptr)
    {
        aMessage.SetEndpoint(&mEndpoint);
    }

    error = aMessage.GetEndpoint()->Send(data, aMessage.GetSubType());
    SuccessOrExit(error);

exit:
    return error;
}